

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qppmhandler.cpp
# Opt level: O0

bool __thiscall QPpmHandler::canRead(QPpmHandler *this)

{
  bool bVar1;
  QImageIOHandler *in_RDI;
  QImageIOHandler *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = in_RDI;
  if (*(int *)&in_RDI[1]._vptr_QImageIOHandler == 0) {
    QImageIOHandler::device(in_RDI);
    bVar1 = canRead((QIODevice *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                    (QByteArray *)this_00);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = *(int *)&in_RDI[1]._vptr_QImageIOHandler != 2;
  if (bVar1) {
    QImageIOHandler::setFormat(this_00,(QByteArray *)in_RDI);
  }
  return bVar1;
}

Assistant:

bool QPpmHandler::canRead() const
{
    if (state == Ready && !canRead(device(), &subType))
        return false;

    if (state != Error) {
        setFormat(subType);
        return true;
    }

    return false;
}